

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBinUtilsLinuxELFLinker.cxx
# Opt level: O2

bool __thiscall
cmBinUtilsLinuxELFLinker::ResolveDependency
          (cmBinUtilsLinuxELFLinker *this,string *name,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *searchPaths,string *path,bool *resolved)

{
  pointer pbVar1;
  bool bVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar3;
  ostream *poVar4;
  cmMakefile *this_00;
  pointer pbVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  ostringstream warning;
  
  pbVar5 = (searchPaths->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (searchPaths->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pbVar5 == pbVar1) {
      pvVar3 = cmRuntimeDependencyArchive::GetSearchDirectories_abi_cxx11_
                         ((this->super_cmBinUtilsLinker).Archive);
      pbVar5 = (pvVar3->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pbVar1 = (pvVar3->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      while( true ) {
        if (pbVar5 == pbVar1) {
          *resolved = false;
          return true;
        }
        std::operator+(&local_1c8,pbVar5,'/');
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&warning
                       ,&local_1c8,name);
        std::__cxx11::string::operator=((string *)path,(string *)&warning);
        std::__cxx11::string::~string((string *)&warning);
        std::__cxx11::string::~string((string *)&local_1c8);
        bVar2 = cmsys::SystemTools::PathExists(path);
        if (bVar2) break;
        pbVar5 = pbVar5 + 1;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&warning);
      poVar4 = std::operator<<((ostream *)&warning,"Dependency ");
      poVar4 = std::operator<<(poVar4,(string *)name);
      poVar4 = std::operator<<(poVar4," found in search directory:\n  ");
      poVar4 = std::operator<<(poVar4,(string *)pbVar5);
      poVar4 = std::operator<<(poVar4,"\nSee file(GET_RUNTIME_DEPENDENCIES) documentation for ");
      std::operator<<(poVar4,"more information.");
      this_00 = cmRuntimeDependencyArchive::GetMakefile((this->super_cmBinUtilsLinker).Archive);
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(this_00,WARNING,&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
      *resolved = true;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&warning);
      return true;
    }
    std::operator+(&local_1c8,pbVar5,'/');
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&warning,
                   &local_1c8,name);
    std::__cxx11::string::operator=((string *)path,(string *)&warning);
    std::__cxx11::string::~string((string *)&warning);
    std::__cxx11::string::~string((string *)&local_1c8);
    bVar2 = cmsys::SystemTools::PathExists(path);
    pbVar5 = pbVar5 + 1;
  } while (!bVar2);
  *resolved = true;
  return true;
}

Assistant:

bool cmBinUtilsLinuxELFLinker::ResolveDependency(
  std::string const& name, std::vector<std::string> const& searchPaths,
  std::string& path, bool& resolved)
{
  for (auto const& searchPath : searchPaths) {
    path = searchPath + '/' + name;
    if (cmSystemTools::PathExists(path)) {
      resolved = true;
      return true;
    }
  }

  for (auto const& searchPath : this->Archive->GetSearchDirectories()) {
    path = searchPath + '/' + name;
    if (cmSystemTools::PathExists(path)) {
      std::ostringstream warning;
      warning << "Dependency " << name << " found in search directory:\n  "
              << searchPath
              << "\nSee file(GET_RUNTIME_DEPENDENCIES) documentation for "
              << "more information.";
      this->Archive->GetMakefile()->IssueMessage(MessageType::WARNING,
                                                 warning.str());
      resolved = true;
      return true;
    }
  }

  resolved = false;
  return true;
}